

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynClassElements * ParseClassElements(ParseContext *ctx)

{
  Lexeme *begin;
  Lexeme *pLVar1;
  int iVar2;
  SynTypedef *node;
  SynClassStaticIf *node_00;
  SynFunctionDefinition *node_01;
  SynAccessor *node_02;
  SynVariableDefinitions *node_03;
  SynConstantSet *node_04;
  undefined4 extraout_var;
  Lexeme *end;
  IntrusiveList<SynConstantSet> constantSets;
  IntrusiveList<SynClassStaticIf> staticIfs;
  IntrusiveList<SynVariableDefinitions> members;
  IntrusiveList<SynAccessor> accessors;
  IntrusiveList<SynFunctionDefinition> functions;
  IntrusiveList<SynTypedef> typedefs;
  IntrusiveList<SynConstantSet> local_f8;
  SynTypedef *local_e8;
  SynTypedef *pSStack_e0;
  IntrusiveList<SynClassStaticIf> local_d8;
  IntrusiveList<SynVariableDefinitions> local_c8;
  IntrusiveList<SynAccessor> local_b8;
  IntrusiveList<SynFunctionDefinition> local_a8;
  IntrusiveList<SynTypedef> local_98;
  SynFunctionDefinition *local_88;
  SynFunctionDefinition *pSStack_80;
  SynAccessor *local_78;
  SynAccessor *pSStack_70;
  SynVariableDefinitions *local_68;
  SynVariableDefinitions *pSStack_60;
  SynConstantSet *local_58;
  SynConstantSet *pSStack_50;
  SynClassStaticIf *local_48;
  SynClassStaticIf *pSStack_40;
  SynClassElements *this;
  
  begin = ctx->currentLexeme;
  local_98.head = (SynTypedef *)0x0;
  local_98.tail = (SynTypedef *)0x0;
  local_a8.head = (SynFunctionDefinition *)0x0;
  local_a8.tail = (SynFunctionDefinition *)0x0;
  local_b8.head = (SynAccessor *)0x0;
  local_b8.tail = (SynAccessor *)0x0;
  local_c8.head = (SynVariableDefinitions *)0x0;
  local_c8.tail = (SynVariableDefinitions *)0x0;
  local_f8.head = (SynConstantSet *)0x0;
  local_f8.tail = (SynConstantSet *)0x0;
  local_d8.head = (SynClassStaticIf *)0x0;
  local_d8.tail = (SynClassStaticIf *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              node = ParseTypedef(ctx);
              if (node == (SynTypedef *)0x0) break;
              IntrusiveList<SynTypedef>::push_back(&local_98,node);
            }
            node_00 = ParseClassStaticIf(ctx,false);
            if (node_00 == (SynClassStaticIf *)0x0) break;
            IntrusiveList<SynClassStaticIf>::push_back(&local_d8,node_00);
          }
          node_01 = ParseFunctionDefinition(ctx);
          if (node_01 == (SynFunctionDefinition *)0x0) break;
          IntrusiveList<SynFunctionDefinition>::push_back(&local_a8,node_01);
        }
        node_02 = ParseAccessorDefinition(ctx);
        if (node_02 == (SynAccessor *)0x0) break;
        IntrusiveList<SynAccessor>::push_back(&local_b8,node_02);
      }
      node_03 = ParseVariableDefinitions(ctx,true);
      if (node_03 == (SynVariableDefinitions *)0x0) break;
      IntrusiveList<SynVariableDefinitions>::push_back(&local_c8,node_03);
    }
    node_04 = ParseConstantSet(ctx);
    if (node_04 == (SynConstantSet *)0x0) break;
    IntrusiveList<SynConstantSet>::push_back(&local_f8,node_04);
  }
  pLVar1 = ctx->currentLexeme;
  end = begin;
  if (begin != pLVar1) {
    if (pLVar1 <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    end = pLVar1 + -1;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
  this = (SynClassElements *)CONCAT44(extraout_var,iVar2);
  local_88 = local_a8.head;
  pSStack_80 = local_a8.tail;
  local_78 = local_b8.head;
  pSStack_70 = local_b8.tail;
  local_68 = local_c8.head;
  pSStack_60 = local_c8.tail;
  local_58 = local_f8.head;
  pSStack_50 = local_f8.tail;
  local_48 = local_d8.head;
  pSStack_40 = local_d8.tail;
  local_e8 = local_98.head;
  pSStack_e0 = local_98.tail;
  SynBase::SynBase((SynBase *)this,0x3e,begin,end);
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00222a98;
  (this->typedefs).head = local_e8;
  (this->typedefs).tail = pSStack_e0;
  (this->functions).head = local_88;
  (this->functions).tail = pSStack_80;
  (this->accessors).head = local_78;
  (this->accessors).tail = pSStack_70;
  (this->members).head = local_68;
  (this->members).tail = pSStack_60;
  (this->constantSets).head = local_58;
  (this->constantSets).tail = pSStack_50;
  (this->staticIfs).head = local_48;
  (this->staticIfs).tail = pSStack_40;
  return this;
}

Assistant:

SynClassElements* ParseClassElements(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	IntrusiveList<SynTypedef> typedefs;
	IntrusiveList<SynFunctionDefinition> functions;
	IntrusiveList<SynAccessor> accessors;
	IntrusiveList<SynVariableDefinitions> members;
	IntrusiveList<SynConstantSet> constantSets;
	IntrusiveList<SynClassStaticIf> staticIfs;

	for(;;)
	{
		if(SynTypedef *node = ParseTypedef(ctx))
		{
			typedefs.push_back(node);
		}
		else if(SynClassStaticIf *node = ParseClassStaticIf(ctx, false))
		{
			staticIfs.push_back(node);
		}
		else if(SynFunctionDefinition *node = ParseFunctionDefinition(ctx))
		{
			functions.push_back(node);
		}
		else if(SynAccessor *node = ParseAccessorDefinition(ctx))
		{
			accessors.push_back(node);
		}
		else if(SynVariableDefinitions *node = ParseVariableDefinitions(ctx, true))
		{
			members.push_back(node);
		}
		else if(SynConstantSet *node = ParseConstantSet(ctx))
		{
			constantSets.push_back(node);
		}
		else
		{
			break;
		}
	}

	Lexeme *end = start == ctx.currentLexeme ? start : ctx.Previous();

	return new (ctx.get<SynClassElements>()) SynClassElements(start, end, typedefs, functions, accessors, members, constantSets, staticIfs);
}